

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleiter.cpp
# Opt level: O2

UChar32 __thiscall icu_63::RuleCharacterIterator::_current(RuleCharacterIterator *this)

{
  char16_t cVar1;
  short sVar2;
  uint uVar3;
  UnicodeString *pUVar4;
  uint uVar5;
  UChar32 UVar6;
  int iVar7;
  uint uVar8;
  char16_t *pcVar9;
  
  if (this->buf != (UnicodeString *)0x0) {
    UVar6 = UnicodeString::char32At(this->buf,this->bufPos);
    return UVar6;
  }
  pUVar4 = this->text;
  uVar3 = this->pos->index;
  sVar2 = (pUVar4->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    iVar7 = (pUVar4->fUnion).fFields.fLength;
  }
  else {
    iVar7 = (int)sVar2 >> 5;
  }
  if (iVar7 <= (int)uVar3) {
    return -1;
  }
  sVar2 = (pUVar4->fUnion).fStackFields.fLengthAndFlags;
  if (sVar2 < 0) {
    uVar8 = (pUVar4->fUnion).fFields.fLength;
  }
  else {
    uVar8 = (int)sVar2 >> 5;
  }
  uVar5 = 0xffff;
  if (uVar3 < uVar8) {
    if (((int)sVar2 & 2U) == 0) {
      pcVar9 = (pUVar4->fUnion).fFields.fArray;
    }
    else {
      pcVar9 = (char16_t *)((long)&pUVar4->fUnion + 2);
    }
    cVar1 = pcVar9[(int)uVar3];
    uVar5 = (uint)(ushort)cVar1;
    if ((cVar1 & 0xf800U) == 0xd800) {
      if (((ushort)cVar1 >> 10 & 1) == 0) {
        if (uVar3 + 1 == uVar8) {
          return uVar5;
        }
        uVar8 = (uint)(ushort)pcVar9[(int)(uVar3 + 1)];
        if ((pcVar9[(int)(uVar3 + 1)] & 0xfc00U) != 0xdc00) {
          return uVar5;
        }
        uVar5 = (uint)(ushort)cVar1 << 10;
      }
      else {
        if ((int)uVar3 < 1) {
          return uVar5;
        }
        if ((pcVar9[(ulong)uVar3 - 1] & 0xfc00U) != 0xd800) {
          return uVar5;
        }
        uVar8 = (uint)(ushort)pcVar9[(ulong)uVar3 - 1] << 10;
      }
      uVar5 = uVar5 + uVar8 + 0xfca02400;
    }
  }
  return uVar5;
}

Assistant:

UChar32 RuleCharacterIterator::_current() const {
    if (buf != 0) {
        return buf->char32At(bufPos);
    } else {
        int i = pos.getIndex();
        return (i < text.length()) ? text.char32At(i) : (UChar32)DONE;
    }
}